

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VConstVectorArray(int nvec,realtype c,N_Vector *Z)

{
  long *in_RSI;
  int in_EDI;
  undefined8 in_XMM0_Qa;
  int ier;
  int i;
  int local_20;
  int local_1c;
  
  if (*(long *)(*(long *)(*in_RSI + 8) + 0x110) == 0) {
    for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
      (**(code **)(*(long *)(*in_RSI + 8) + 0x58))(in_XMM0_Qa,in_RSI[local_1c]);
    }
    local_20 = 0;
  }
  else {
    local_20 = (**(code **)(*(long *)(*in_RSI + 8) + 0x110))(in_XMM0_Qa,in_EDI,in_RSI);
  }
  return local_20;
}

Assistant:

int N_VConstVectorArray(int nvec, realtype c, N_Vector* Z)
{
  int i, ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(Z[0]));

  if (Z[0]->ops->nvconstvectorarray != NULL) {

    ier = Z[0]->ops->nvconstvectorarray(nvec, c, Z);

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvconst(c, Z[i]);
    }
    ier = 0;

  }

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(Z[0]));
  return(ier);
}